

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

StructReader * __thiscall
capnp::_::PointerReader::getStruct
          (StructReader *__return_storage_ptr__,PointerReader *this,word *defaultValue)

{
  WirePointer *local_40;
  WirePointer *ref;
  word *defaultValue_local;
  PointerReader *this_local;
  
  if (this->pointer == (WirePointer *)0x0) {
    local_40 = (WirePointer *)&(anonymous_namespace)::zero;
  }
  else {
    local_40 = this->pointer;
  }
  WireHelpers::readStructPointer
            (__return_storage_ptr__,this->segment,this->capTable,local_40,defaultValue,
             this->nestingLimit);
  return __return_storage_ptr__;
}

Assistant:

StructReader PointerReader::getStruct(const word* defaultValue) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readStructPointer(segment, capTable, ref, defaultValue, nestingLimit);
}